

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

uint32_t recall_tree_ns::oas_predict(recall_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  uchar **ppuVar1;
  float fVar2;
  label_t lVar3;
  node *pnVar4;
  uint32_t uVar5;
  node_pred *pnVar6;
  float local_40;
  
  lVar3 = (ec->l).multi;
  fVar2 = (ec->pred).scalar;
  add_node_id_feature(b,cn,ec);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar4 = (b->nodes)._begin;
  pnVar6 = pnVar4[cn].preds._begin;
  local_40 = -3.4028235e+38;
  uVar5 = 0;
  for (; (pnVar6 != pnVar4[cn].preds._end && (pnVar6 < pnVar4[cn].preds._begin + b->max_candidates))
      ; pnVar6 = pnVar6 + 1) {
    LEARNER::learner<char,_example>::predict(base,ec,(b->max_routers + (ulong)pnVar6->label) - 1);
    if ((uVar5 == 0) || (local_40 < ec->partial_prediction)) {
      uVar5 = pnVar6->label;
      local_40 = ec->partial_prediction;
    }
    pnVar4 = (b->nodes)._begin;
  }
  features::clear((ec->super_example_predict).feature_space + 0x88);
  ppuVar1 = &(ec->super_example_predict).indices._end;
  *ppuVar1 = *ppuVar1 + -1;
  (ec->l).multi = lVar3;
  (ec->pred).scalar = fVar2;
  return uVar5;
}

Assistant:

uint32_t oas_predict(recall_tree& b, single_learner& base, uint32_t cn, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  uint32_t amaxscore = 0;

  add_node_id_feature(b, cn, ec);
  ec.l.simple = {FLT_MAX, 0.f, 0.f};

  float maxscore = std::numeric_limits<float>::lowest();
  for (node_pred* ls = b.nodes[cn].preds.begin();
       ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
  {
    base.predict(ec, b.max_routers + ls->label - 1);
    if (amaxscore == 0 || ec.partial_prediction > maxscore)
    {
      maxscore = ec.partial_prediction;
      amaxscore = ls->label;
    }
  }

  remove_node_id_feature(b, cn, ec);

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return amaxscore;
}